

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

int gtTileSeparate(TIFFRGBAImage *img,uint32_t *raster,uint32_t w,uint32_t h)

{
  int iVar1;
  TIFF *pTVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  tmsize_t tVar6;
  char *module;
  uint32_t uVar7;
  int iVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint32_t *puVar15;
  uint32_t y;
  uint32_t *puVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  bool bVar20;
  uint local_108;
  uint32_t th;
  uint32_t tw;
  uchar *local_e8;
  uchar *local_e0;
  uchar *local_d8;
  uchar *local_d0;
  uchar *buf;
  uint32_t *local_c0;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  ulong local_a0;
  tmsize_t local_98;
  TIFFRGBAImage *local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  long local_68;
  tmsize_t local_60;
  anon_union_8_3_994a2fbf_for_put local_58;
  TIFF *local_50;
  uint32_t *local_48;
  ulong local_40;
  ulong local_38;
  
  pTVar2 = img->tif;
  local_58 = img->put;
  buf = (uchar *)0x0;
  iVar1 = img->alpha;
  local_c0 = raster;
  local_98 = TIFFTileSize(pTVar2);
  local_60 = _TIFFMultiplySSize(pTVar2,4 - (ulong)(iVar1 == 0),local_98,"gtTileSeparate");
  if (local_60 == 0) {
    return 0;
  }
  TIFFGetField(pTVar2,0x142,&tw);
  TIFFGetField(pTVar2,0x143,&th);
  uVar4 = setorientation(img);
  if ((uVar4 & 1) == 0) {
    if (w + 0x7fffffff < tw) {
LAB_00260484:
      module = TIFFFileName(pTVar2);
      TIFFErrorExtR(pTVar2,module,"%s","unsupported tile size (too wide)");
      return 0;
    }
    local_b4 = w - tw;
    local_108 = 0;
  }
  else {
    if ((int)(tw + w) < 0) goto LAB_00260484;
    local_108 = h - 1;
    local_b4 = -(tw + w);
  }
  local_78 = (ulong)local_b4;
  iVar19 = *(int *)&img->photometric;
  bVar20 = (ushort)iVar19 < 4;
  uVar3 = 3;
  if (bVar20) {
    uVar3 = (ushort)(0x1000300010001 >> ((byte)(iVar19 << 4) & 0x3f));
  }
  bVar9 = bVar20 & 0xbU >> ((byte)iVar19 & 0xf);
  local_d8 = (uchar *)0x0;
  local_b0 = (uint)img->col_offset % tw;
  local_ac = tw - local_b0;
  local_b4 = local_b0 + local_b4;
  local_68 = local_98 * 3;
  local_a0 = (ulong)w;
  iVar19 = 1;
  local_a8 = (uint)uVar3;
  local_e8 = (uchar *)0x0;
  local_e0 = (uchar *)0x0;
  local_d0 = (uchar *)0x0;
  uVar14 = 0;
  local_90 = img;
  local_70 = (ulong)h;
  local_50 = pTVar2;
  while (uVar18 = (uint)local_70, iVar19 != 0) {
    uVar10 = (uint)uVar14;
    if (uVar18 < uVar10 || uVar18 - uVar10 == 0) break;
    uVar17 = 0;
    uVar12 = th - (img->row_offset + uVar10) % th;
    if (uVar18 < uVar12 + uVar10) {
      uVar12 = uVar18 - uVar10;
    }
    local_88 = (ulong)uVar12;
    uVar7 = img->col_offset;
    local_48 = local_c0 + local_108 * local_a0;
    uVar13 = (ulong)local_b4;
    uVar10 = local_b0;
    uVar18 = local_ac;
    local_80 = uVar14;
    while( true ) {
      pTVar2 = local_50;
      img = local_90;
      iVar11 = (int)local_80;
      if (w < uVar17 || w - uVar17 == 0) break;
      y = local_90->row_offset + iVar11;
      local_a4 = uVar10;
      local_40 = uVar13;
      local_38 = (ulong)uVar18;
      if (buf != (uchar *)0x0) {
        tVar6 = TIFFReadTile(local_50,local_d0,uVar7,y,0,0);
        if ((tVar6 != -1) || (img->stoponerr == 0)) {
          if (bVar9 == 0) goto LAB_00260297;
          goto LAB_00260302;
        }
LAB_0026043e:
        iVar19 = 0;
        goto LAB_00260441;
      }
      tVar6 = _TIFFReadTileAndAllocBuffer(local_50,&buf,local_60,uVar7,y,0,0);
      if ((tVar6 == -1) && ((iVar19 = 0, buf == (uchar *)0x0 || (img->stoponerr != 0))))
      goto LAB_00260441;
      if (bVar9 == 0) {
        local_e0 = buf + local_98;
        local_e8 = local_e0 + local_98;
        local_d8 = (uchar *)0x0;
        if (iVar1 != 0) {
          local_d8 = local_e8 + local_98;
        }
        local_d0 = buf;
LAB_00260297:
        tVar6 = TIFFReadTile(pTVar2,local_e0,uVar7,img->row_offset + iVar11,0,1);
        if (((tVar6 == -1) && (img->stoponerr != 0)) ||
           ((tVar6 = TIFFReadTile(pTVar2,local_e8,uVar7,img->row_offset + iVar11,0,2), tVar6 == -1
            && (img->stoponerr != 0)))) goto LAB_0026043e;
      }
      else {
        local_d8 = (uchar *)0x0;
        if (iVar1 != 0) {
          local_d8 = buf + local_68;
        }
        local_d0 = buf;
        local_e0 = buf;
        local_e8 = buf;
      }
LAB_00260302:
      if (((iVar1 != 0) &&
          (tVar6 = TIFFReadTile(pTVar2,local_d8,uVar7,img->row_offset + iVar11,0,(uint16_t)local_a8)
          , tVar6 == -1)) && (img->stoponerr != 0)) goto LAB_0026043e;
      TIFFTileRowSize(pTVar2);
      iVar19 = (int)local_38;
      if (w < uVar17 + (int)local_38) {
        iVar19 = w - uVar17;
      }
      (*local_58.any)(img);
      uVar17 = uVar17 + iVar19;
      uVar7 = uVar7 + iVar19;
      uVar10 = 0;
      uVar13 = local_78;
      uVar18 = tw;
    }
    iVar19 = 1;
LAB_00260441:
    iVar8 = (int)local_88;
    iVar5 = -iVar8;
    if ((uVar4 & 1) == 0) {
      iVar5 = iVar8;
    }
    local_108 = local_108 + iVar5;
    uVar14 = (ulong)(uint)(iVar11 + iVar8);
  }
  if (1 < uVar4) {
    uVar4 = 0;
    for (uVar14 = 0; uVar14 != (local_70 & 0xffffffff); uVar14 = uVar14 + 1) {
      puVar15 = local_c0 + local_a0 + ((ulong)uVar4 - 1);
      for (puVar16 = local_c0 + (int)uVar14 * w; puVar16 < puVar15; puVar16 = puVar16 + 1) {
        uVar7 = *puVar16;
        *puVar16 = *puVar15;
        *puVar15 = uVar7;
        puVar15 = puVar15 + -1;
      }
      uVar4 = uVar4 + w;
    }
  }
  _TIFFfreeExt(img->tif,buf);
  return iVar19;
}

Assistant:

static int gtTileSeparate(TIFFRGBAImage *img, uint32_t *raster, uint32_t w,
                          uint32_t h)
{
    TIFF *tif = img->tif;
    tileSeparateRoutine put = img->put.separate;
    uint32_t col, row, y, rowstoread;
    tmsize_t pos;
    uint32_t tw, th;
    unsigned char *buf = NULL;
    unsigned char *p0 = NULL;
    unsigned char *p1 = NULL;
    unsigned char *p2 = NULL;
    unsigned char *pa = NULL;
    tmsize_t tilesize;
    tmsize_t bufsize;
    int32_t fromskew, toskew;
    int alpha = img->alpha;
    uint32_t nrow;
    int ret = 1, flip;
    uint16_t colorchannels;
    uint32_t this_tw, tocol;
    int32_t this_toskew, leftmost_toskew;
    int32_t leftmost_fromskew;
    uint32_t leftmost_tw;

    tilesize = TIFFTileSize(tif);
    bufsize =
        _TIFFMultiplySSize(tif, alpha ? 4 : 3, tilesize, "gtTileSeparate");
    if (bufsize == 0)
    {
        return (0);
    }

    TIFFGetField(tif, TIFFTAG_TILEWIDTH, &tw);
    TIFFGetField(tif, TIFFTAG_TILELENGTH, &th);

    flip = setorientation(img);
    if (flip & FLIP_VERTICALLY)
    {
        if ((tw + w) > INT_MAX)
        {
            TIFFErrorExtR(tif, TIFFFileName(tif), "%s",
                          "unsupported tile size (too wide)");
            return (0);
        }
        y = h - 1;
        toskew = -(int32_t)(tw + w);
    }
    else
    {
        if (tw > (INT_MAX + w))
        {
            TIFFErrorExtR(tif, TIFFFileName(tif), "%s",
                          "unsupported tile size (too wide)");
            return (0);
        }
        y = 0;
        toskew = -(int32_t)(tw - w);
    }

    switch (img->photometric)
    {
        case PHOTOMETRIC_MINISWHITE:
        case PHOTOMETRIC_MINISBLACK:
        case PHOTOMETRIC_PALETTE:
            colorchannels = 1;
            break;

        default:
            colorchannels = 3;
            break;
    }

    /*
     *	Leftmost tile is clipped on left side if col_offset > 0.
     */
    leftmost_fromskew = img->col_offset % tw;
    leftmost_tw = tw - leftmost_fromskew;
    leftmost_toskew = toskew + leftmost_fromskew;
    for (row = 0; ret != 0 && row < h; row += nrow)
    {
        rowstoread = th - (row + img->row_offset) % th;
        nrow = (row + rowstoread > h ? h - row : rowstoread);
        fromskew = leftmost_fromskew;
        this_tw = leftmost_tw;
        this_toskew = leftmost_toskew;
        tocol = 0;
        col = img->col_offset;
        while (tocol < w)
        {
            if (buf == NULL)
            {
                if (_TIFFReadTileAndAllocBuffer(tif, (void **)&buf, bufsize,
                                                col, row + img->row_offset, 0,
                                                0) == (tmsize_t)(-1) &&
                    (buf == NULL || img->stoponerr))
                {
                    ret = 0;
                    break;
                }
                p0 = buf;
                if (colorchannels == 1)
                {
                    p2 = p1 = p0;
                    pa = (alpha ? (p0 + 3 * tilesize) : NULL);
                }
                else
                {
                    p1 = p0 + tilesize;
                    p2 = p1 + tilesize;
                    pa = (alpha ? (p2 + tilesize) : NULL);
                }
            }
            else if (TIFFReadTile(tif, p0, col, row + img->row_offset, 0, 0) ==
                         (tmsize_t)(-1) &&
                     img->stoponerr)
            {
                ret = 0;
                break;
            }
            if (colorchannels > 1 &&
                TIFFReadTile(tif, p1, col, row + img->row_offset, 0, 1) ==
                    (tmsize_t)(-1) &&
                img->stoponerr)
            {
                ret = 0;
                break;
            }
            if (colorchannels > 1 &&
                TIFFReadTile(tif, p2, col, row + img->row_offset, 0, 2) ==
                    (tmsize_t)(-1) &&
                img->stoponerr)
            {
                ret = 0;
                break;
            }
            if (alpha &&
                TIFFReadTile(tif, pa, col, row + img->row_offset, 0,
                             colorchannels) == (tmsize_t)(-1) &&
                img->stoponerr)
            {
                ret = 0;
                break;
            }

            pos = ((row + img->row_offset) % th) * TIFFTileRowSize(tif) +
                  ((tmsize_t)fromskew * img->samplesperpixel);
            if (tocol + this_tw > w)
            {
                /*
                 * Rightmost tile is clipped on right side.
                 */
                fromskew = tw - (w - tocol);
                this_tw = tw - fromskew;
                this_toskew = toskew + fromskew;
            }
            tmsize_t roffset = (tmsize_t)y * w + tocol;
            (*put)(img, raster + roffset, tocol, y, this_tw, nrow, fromskew,
                   this_toskew, p0 + pos, p1 + pos, p2 + pos,
                   (alpha ? (pa + pos) : NULL));
            tocol += this_tw;
            col += this_tw;
            /*
             * After the leftmost tile, tiles are no longer clipped on left
             * side.
             */
            fromskew = 0;
            this_tw = tw;
            this_toskew = toskew;
        }

        y += ((flip & FLIP_VERTICALLY) ? -(int32_t)nrow : (int32_t)nrow);
    }

    if (flip & FLIP_HORIZONTALLY)
    {
        uint32_t line;

        for (line = 0; line < h; line++)
        {
            uint32_t *left = raster + (line * w);
            uint32_t *right = left + w - 1;

            while (left < right)
            {
                uint32_t temp = *left;
                *left = *right;
                *right = temp;
                left++;
                right--;
            }
        }
    }

    _TIFFfreeExt(img->tif, buf);
    return (ret);
}